

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O3

void __thiscall
Assimp::MD5Importer::AttachChilds_Mesh
          (MD5Importer *this,int iParentID,aiNode *piParent,BoneList *bones)

{
  uint *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  pointer pBVar33;
  aiNode **ppaVar34;
  aiNode *this_00;
  uint uVar35;
  pointer pBVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float local_498;
  float fStack_494;
  float fStack_490;
  undefined1 local_430 [1024];
  
  if ((piParent != (aiNode *)0x0) && (piParent->mNumChildren == 0)) {
    pBVar33 = (bones->
              super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pBVar36 = (bones->
              super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)pBVar36 - (long)pBVar33) >> 2) * -0x66e9095b) {
      uVar35 = 0;
      lVar38 = 0x404;
      uVar37 = 0;
      do {
        if (((uint)iParentID != uVar37) &&
           (*(int *)((long)(pBVar33->super_BaseJointDescription).mName.data +
                    lVar38 + 0xfffffffffffffffcU) == iParentID)) {
          uVar35 = uVar35 + 1;
          piParent->mNumChildren = uVar35;
          pBVar33 = (bones->
                    super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pBVar36 = (bones->
                    super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar37 = uVar37 + 1;
        lVar38 = lVar38 + 0x4b4;
      } while ((long)uVar37 <
               (long)((int)((ulong)((long)pBVar36 - (long)pBVar33) >> 2) * -0x66e9095b));
      if (uVar35 != 0) {
        uVar37 = (ulong)uVar35;
        ppaVar34 = (aiNode **)operator_new__(uVar37 * 8);
        piParent->mChildren = ppaVar34;
        pBVar33 = (bones->
                  super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar36 = (bones->
                  super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (0 < (int)((ulong)((long)pBVar36 - (long)pBVar33) >> 2) * -0x66e9095b) {
          lVar38 = 0;
          lVar39 = 0;
          do {
            if (((ulong)(uint)iParentID * 0x4b4 != lVar38) &&
               (*(int *)((long)&(pBVar33->super_BaseJointDescription).mParentIndex + lVar38) ==
                iParentID)) {
              this_00 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(this_00);
              ppaVar34 = piParent->mChildren;
              piParent->mChildren = ppaVar34 + 1;
              *ppaVar34 = this_00;
              pBVar33 = (bones->
                        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (uint *)((long)(pBVar33->super_BaseJointDescription).mName.data +
                               lVar38 + 0xfffffffffffffffcU);
              uVar35 = *puVar1;
              if (0x3fe < *puVar1) {
                uVar35 = 0x3ff;
              }
              uVar37 = (ulong)uVar35;
              memcpy(local_430,puVar1 + 1,uVar37);
              local_430[uVar37] = 0;
              (this_00->mName).length = uVar35;
              memcpy((this_00->mName).data,local_430,uVar37);
              (this_00->mName).data[uVar37] = '\0';
              this_00->mParent = piParent;
              fVar47 = (float)*(undefined8 *)(puVar1 + 0x105);
              fVar48 = (float)((ulong)*(undefined8 *)(puVar1 + 0x105) >> 0x20);
              fVar46 = (float)puVar1[0x107];
              fVar44 = fVar46 * fVar46;
              fVar41 = ((1.0 - fVar47 * fVar47) - fVar48 * fVar48) - fVar44;
              fVar40 = 0.0;
              if (0.0 <= fVar41) {
                if (fVar41 < 0.0) {
                  fVar40 = sqrtf(fVar41);
                }
                else {
                  fVar40 = SQRT(fVar41);
                }
                pBVar33 = (bones->
                          super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              }
              fVar41 = fVar48 * fVar48 + fVar44;
              fVar42 = fVar47 * fVar48 - fVar46 * fVar40;
              fVar44 = fVar44 + fVar47 * fVar47;
              fVar49 = fVar48 * fVar46 + fVar47 * fVar40;
              fVar45 = fVar48 * fVar48 + fVar47 * fVar47;
              *(float *)((long)&(pBVar33->mTransform).a1 + lVar38) = 1.0 - (fVar41 + fVar41);
              fVar41 = fVar47 * fVar48 + fVar46 * fVar40;
              fVar43 = fVar46 * fVar47 + fVar48 * -fVar40;
              *(ulong *)((long)&(pBVar33->mTransform).a2 + lVar38) =
                   CONCAT44(fVar43 + fVar43,fVar41 + fVar41);
              *(undefined4 *)((long)&(pBVar33->mTransform).a4 + lVar38) = 0;
              *(float *)((long)&(pBVar33->mTransform).b1 + lVar38) = fVar42 + fVar42;
              *(float *)((long)&(pBVar33->mTransform).b2 + lVar38) = 1.0 - (fVar44 + fVar44);
              *(float *)((long)&(pBVar33->mTransform).b3 + lVar38) = fVar49 + fVar49;
              *(undefined4 *)((long)&(pBVar33->mTransform).b4 + lVar38) = 0;
              fVar41 = fVar46 * fVar47 + fVar40 * fVar48;
              fVar46 = fVar46 * fVar48 + -fVar40 * fVar47;
              *(ulong *)((long)&(pBVar33->mTransform).c1 + lVar38) =
                   CONCAT44(fVar46 + fVar46,fVar41 + fVar41);
              *(float *)((long)&(pBVar33->mTransform).c3 + lVar38) = 1.0 - (fVar45 + fVar45);
              puVar2 = (undefined8 *)((long)&(pBVar33->mTransform).c4 + lVar38);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined4 *)((long)&(pBVar33->mTransform).d4 + lVar38) = 0x3f800000;
              pBVar33 = (bones->
                        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)((long)&(pBVar33->mTransform).a4 + lVar38) =
                   *(undefined4 *)((long)&(pBVar33->mPositionXYZ).x + lVar38);
              pBVar33 = (bones->
                        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)((long)&(pBVar33->mTransform).b4 + lVar38) =
                   *(undefined4 *)((long)&(pBVar33->mPositionXYZ).y + lVar38);
              pBVar33 = (bones->
                        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)((long)&(pBVar33->mTransform).c4 + lVar38) =
                   *(undefined4 *)((long)&(pBVar33->mPositionXYZ).z + lVar38);
              pBVar33 = (bones->
                        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (undefined8 *)((long)&(pBVar33->mTransform).a1 + lVar38);
              uVar22 = *puVar2;
              uVar23 = puVar2[1];
              puVar2 = (undefined8 *)((long)&(pBVar33->mTransform).b1 + lVar38);
              uVar24 = *puVar2;
              uVar25 = puVar2[1];
              puVar2 = (undefined8 *)((long)&(pBVar33->mTransform).c1 + lVar38);
              uVar26 = *puVar2;
              uVar27 = puVar2[1];
              puVar2 = (undefined8 *)((long)&(pBVar33->mTransform).d1 + lVar38);
              uVar28 = *puVar2;
              uVar29 = puVar2[1];
              puVar2 = (undefined8 *)((long)&(pBVar33->mInvTransform).d1 + lVar38);
              *puVar2 = uVar28;
              puVar2[1] = uVar29;
              puVar2 = (undefined8 *)((long)&(pBVar33->mInvTransform).c1 + lVar38);
              *puVar2 = uVar26;
              puVar2[1] = uVar27;
              puVar2 = (undefined8 *)((long)&(pBVar33->mInvTransform).b1 + lVar38);
              *puVar2 = uVar24;
              puVar2[1] = uVar25;
              puVar2 = (undefined8 *)((long)&(pBVar33->mInvTransform).a1 + lVar38);
              *puVar2 = uVar22;
              puVar2[1] = uVar23;
              (this_00->mTransformation).c1 = (float)(int)uVar26;
              (this_00->mTransformation).c2 = (float)(int)((ulong)uVar26 >> 0x20);
              (this_00->mTransformation).c3 = (float)(int)uVar27;
              (this_00->mTransformation).c4 = (float)(int)((ulong)uVar27 >> 0x20);
              (this_00->mTransformation).a1 = (float)(int)uVar22;
              (this_00->mTransformation).a2 = (float)(int)((ulong)uVar22 >> 0x20);
              (this_00->mTransformation).a3 = (float)(int)uVar23;
              (this_00->mTransformation).a4 = (float)(int)((ulong)uVar23 >> 0x20);
              (this_00->mTransformation).d1 = (float)(int)uVar28;
              (this_00->mTransformation).d2 = (float)(int)((ulong)uVar28 >> 0x20);
              (this_00->mTransformation).d3 = (float)(int)uVar29;
              (this_00->mTransformation).d4 = (float)(int)((ulong)uVar29 >> 0x20);
              (this_00->mTransformation).b1 = (float)(int)uVar24;
              (this_00->mTransformation).b2 = (float)(int)((ulong)uVar24 >> 0x20);
              (this_00->mTransformation).b3 = (float)(int)uVar25;
              (this_00->mTransformation).b4 = (float)(int)((ulong)uVar25 >> 0x20);
              aiMatrix4x4t<float>::Inverse
                        ((aiMatrix4x4t<float> *)
                         ((long)&(((bones->
                                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->mInvTransform).a1 +
                         lVar38));
              if (iParentID != -1) {
                pBVar33 = (bones->
                          super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                fVar46 = pBVar33[iParentID].mInvTransform.a1;
                fVar40 = pBVar33[iParentID].mInvTransform.a2;
                fVar41 = pBVar33[iParentID].mInvTransform.a3;
                fVar44 = pBVar33[iParentID].mInvTransform.a4;
                fVar9 = (this_00->mTransformation).a1;
                fVar10 = (this_00->mTransformation).a2;
                fVar11 = (this_00->mTransformation).a3;
                fVar12 = (this_00->mTransformation).a4;
                fVar13 = (this_00->mTransformation).b1;
                fVar14 = (this_00->mTransformation).b2;
                fVar15 = (this_00->mTransformation).b3;
                fVar16 = (this_00->mTransformation).b4;
                fVar17 = (this_00->mTransformation).c1;
                fVar18 = (this_00->mTransformation).c2;
                fVar19 = (this_00->mTransformation).c3;
                fVar20 = (this_00->mTransformation).c4;
                uVar30 = (this_00->mTransformation).d1;
                uVar31 = (this_00->mTransformation).d2;
                uVar32 = (this_00->mTransformation).d3;
                fVar21 = (this_00->mTransformation).d4;
                fVar47 = pBVar33[iParentID].mInvTransform.b2;
                fVar48 = pBVar33[iParentID].mInvTransform.b1;
                fVar42 = pBVar33[iParentID].mInvTransform.b3;
                fVar43 = pBVar33[iParentID].mInvTransform.b4;
                fVar45 = pBVar33[iParentID].mInvTransform.c2;
                fVar49 = pBVar33[iParentID].mInvTransform.c1;
                fVar3 = pBVar33[iParentID].mInvTransform.c3;
                fVar4 = pBVar33[iParentID].mInvTransform.c4;
                fVar5 = pBVar33[iParentID].mInvTransform.d2;
                fVar6 = pBVar33[iParentID].mInvTransform.d1;
                fVar7 = pBVar33[iParentID].mInvTransform.d3;
                fVar8 = pBVar33[iParentID].mInvTransform.d4;
                (this_00->mTransformation).a1 =
                     fVar44 * (this_00->mTransformation).d1 +
                     fVar41 * fVar17 + fVar46 * fVar9 + fVar40 * fVar13;
                (this_00->mTransformation).a2 =
                     fVar44 * (this_00->mTransformation).d2 +
                     fVar41 * fVar18 + fVar46 * fVar10 + fVar40 * fVar14;
                (this_00->mTransformation).a3 =
                     fVar44 * (this_00->mTransformation).d3 +
                     fVar41 * fVar19 + fVar46 * fVar11 + fVar40 * fVar15;
                (this_00->mTransformation).a4 =
                     fVar44 * fVar21 + fVar41 * fVar20 + fVar46 * fVar12 + fVar40 * fVar16;
                (this_00->mTransformation).b1 =
                     fVar43 * (float)uVar30 + fVar42 * fVar17 + fVar48 * fVar9 + fVar47 * fVar13;
                (this_00->mTransformation).b2 =
                     fVar43 * (float)uVar31 + fVar42 * fVar18 + fVar48 * fVar10 + fVar47 * fVar14;
                (this_00->mTransformation).b3 =
                     fVar43 * (float)uVar32 + fVar42 * fVar19 + fVar48 * fVar11 + fVar47 * fVar15;
                (this_00->mTransformation).b4 =
                     fVar43 * fVar21 + fVar42 * fVar20 + fVar48 * fVar12 + fVar47 * fVar16;
                (this_00->mTransformation).c1 =
                     fVar4 * (float)uVar30 + fVar3 * fVar17 + fVar49 * fVar9 + fVar45 * fVar13;
                (this_00->mTransformation).c2 =
                     fVar4 * (float)uVar31 + fVar3 * fVar18 + fVar49 * fVar10 + fVar45 * fVar14;
                (this_00->mTransformation).c3 =
                     fVar4 * (float)uVar32 + fVar3 * fVar19 + fVar49 * fVar11 + fVar45 * fVar15;
                (this_00->mTransformation).c4 =
                     fVar4 * fVar21 + fVar3 * fVar20 + fVar49 * fVar12 + fVar45 * fVar16;
                (this_00->mTransformation).d1 =
                     fVar8 * (float)uVar30 + fVar7 * fVar17 + fVar6 * fVar9 + fVar5 * fVar13;
                (this_00->mTransformation).d2 =
                     fVar8 * (float)uVar31 + fVar7 * fVar18 + fVar6 * fVar10 + fVar5 * fVar14;
                (this_00->mTransformation).d3 =
                     fVar8 * (float)uVar32 + fVar7 * fVar19 + fVar6 * fVar11 + fVar5 * fVar15;
                (this_00->mTransformation).d4 =
                     fVar8 * fVar21 + fVar7 * fVar20 + fVar6 * fVar12 + fVar5 * fVar16;
              }
              AttachChilds_Mesh(this,(int)lVar39,this_00,bones);
              pBVar33 = (bones->
                        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pBVar36 = (bones->
                        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            }
            lVar39 = lVar39 + 1;
            lVar38 = lVar38 + 0x4b4;
          } while (lVar39 < (int)((ulong)((long)pBVar36 - (long)pBVar33) >> 2) * -0x66e9095b);
          uVar37 = (ulong)piParent->mNumChildren;
          ppaVar34 = piParent->mChildren;
        }
        piParent->mChildren = ppaVar34 + -uVar37;
      }
    }
    return;
  }
  __assert_fail("__null != piParent && !piParent->mNumChildren",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MD5/MD5Loader.cpp"
                ,0x10b,"void Assimp::MD5Importer::AttachChilds_Mesh(int, aiNode *, BoneList &)");
}

Assistant:

void MD5Importer::AttachChilds_Mesh(int iParentID,aiNode* piParent, BoneList& bones)
{
    ai_assert(NULL != piParent && !piParent->mNumChildren);

    // First find out how many children we'll have
    for (int i = 0; i < (int)bones.size();++i)  {
        if (iParentID != i && bones[i].mParentIndex == iParentID)   {
            ++piParent->mNumChildren;
        }
    }
    if (piParent->mNumChildren) {
        piParent->mChildren = new aiNode*[piParent->mNumChildren];
        for (int i = 0; i < (int)bones.size();++i)  {
            // (avoid infinite recursion)
            if (iParentID != i && bones[i].mParentIndex == iParentID)   {
                aiNode* pc;
                // setup a new node
                *piParent->mChildren++ = pc = new aiNode();
                pc->mName = aiString(bones[i].mName);
                pc->mParent = piParent;

                // get the transformation matrix from rotation and translational components
                aiQuaternion quat;
                MD5::ConvertQuaternion ( bones[i].mRotationQuat, quat );

                bones[i].mTransform = aiMatrix4x4 ( quat.GetMatrix());
                bones[i].mTransform.a4 = bones[i].mPositionXYZ.x;
                bones[i].mTransform.b4 = bones[i].mPositionXYZ.y;
                bones[i].mTransform.c4 = bones[i].mPositionXYZ.z;

                // store it for later use
                pc->mTransformation = bones[i].mInvTransform = bones[i].mTransform;
                bones[i].mInvTransform.Inverse();

                // the transformations for each bone are absolute, so we need to multiply them
                // with the inverse of the absolute matrix of the parent joint
                if (-1 != iParentID)    {
                    pc->mTransformation = bones[iParentID].mInvTransform * pc->mTransformation;
                }

                // add children to this node, too
                AttachChilds_Mesh( i, pc, bones);
            }
        }
        // undo offset computations
        piParent->mChildren -= piParent->mNumChildren;
    }
}